

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::AbstractTransaction::GetWeight(AbstractTransaction *this)

{
  CfdException *this_00;
  allocator local_45;
  int ret;
  size_t weight;
  undefined1 local_38 [32];
  
  weight = 0;
  ret = wally_tx_get_weight((wally_tx *)this->wally_tx_pointer_,&weight);
  if (ret == 0) {
    return (uint32_t)weight;
  }
  local_38._0_8_ = "cfdcore_transaction_common.cpp";
  local_38._8_4_ = 0x254;
  local_38._16_8_ = "GetWeight";
  logger::warn<int&>((CfdSourceLocation *)local_38,"wally_tx_get_weight NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"transaction weight calc error.",&local_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t AbstractTransaction::GetWeight() const {
  size_t weight = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_get_weight(tx_pointer, &weight);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_weight NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "transaction weight calc error.");
  }
  return static_cast<uint32_t>(weight);
}